

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_writer.cpp
# Opt level: O3

ssize_t __thiscall diffusion::ShmWriter::write(ShmWriter *this,int __fd,void *__buf,size_t __n)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  Size size_prefix;
  
  uVar2 = this->shm_body_size_;
  uVar4 = this->writer_shm_body_offset_;
  uVar6 = 4;
  do {
    iVar5 = (int)uVar6;
    iVar3 = uVar2 - uVar4;
    if (iVar5 < (int)(uVar2 - uVar4)) {
      iVar3 = iVar5;
    }
    memcpy(this->shm_body_position_ + (int)uVar4,&stack0xffffffffffffffd0 + -uVar6,(long)iVar3);
    uVar4 = this->writer_shm_body_offset_ + iVar3;
    uVar2 = this->shm_body_size_;
    if (uVar4 == uVar2) {
      uVar4 = 0;
    }
    this->writer_shm_body_offset_ = uVar4;
    uVar6 = (ulong)(uint)(iVar5 - iVar3);
  } while (iVar5 - iVar3 != 0 && iVar3 <= iVar5);
  cyclic_write(this,(char *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
  puVar1 = (uint32_t *)this->shm_header_position_;
  *puVar1 = this->writer_shm_body_offset_;
  return (ssize_t)puVar1;
}

Assistant:

void ShmWriter::write(char const *data, std::size_t size) {
    auto size_prefix = static_cast<Size>(size);
    this->cyclic_write(reinterpret_cast<char const *>(&size_prefix), sizeof(size_prefix));
    this->cyclic_write(data, size);
    this->commit();
}